

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)

{
  long lVar1;
  long in_RDI;
  bid_t bid2;
  bid_t bid1;
  void *value;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  long local_68;
  long *local_60;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  memleak_start();
  local_68 = 10;
  local_60 = (long *)(**(code **)(local_8 + 0x70))(&local_68);
  if (*local_60 != local_68) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x362);
    kv_bid_to_value_to_bid_test::__test_pass = 0;
    if (*local_60 != local_68) {
      __assert_fail("*(bid_t *)value == bid1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x362,"void kv_bid_to_value_to_bid_test(btree_kv_ops *)");
    }
  }
  lVar1 = (**(code **)(local_8 + 0x68))(local_60);
  if (lVar1 != local_68) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x366);
    kv_bid_to_value_to_bid_test::__test_pass = 0;
    if (lVar1 != local_68) {
      __assert_fail("bid2 == bid1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x366,"void kv_bid_to_value_to_bid_test(btree_kv_ops *)");
    }
  }
  memleak_end();
  if (kv_bid_to_value_to_bid_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_bid_to_value_to_bid_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_bid_to_value_to_bid_test");
  }
  return;
}

Assistant:

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    void *value;
    bid_t bid1, bid2;


    // bid to str value
    bid1 = 10;
    value = kv_ops->bid2value(&bid1);
    TEST_CHK( *(bid_t *)value == bid1 );

    // value to bid
    bid2 = kv_ops->value2bid(value);
    TEST_CHK( bid2 == bid1 );

    memleak_end();
    TEST_RESULT("kv_bid_to_value_to_bid_test");
}